

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

int __thiscall QPDF::getExtensionLevel(QPDF *this)

{
  int iVar1;
  bool bVar2;
  bool local_1c1;
  bool local_189;
  allocator<char> local_151;
  string local_150 [32];
  QPDFObjectHandle local_130;
  byte local_11b;
  byte local_11a;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0 [32];
  QPDFObjectHandle local_d0;
  byte local_bb;
  byte local_ba;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90 [32];
  QPDFObjectHandle local_70 [2];
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  QPDFObjectHandle obj;
  int result;
  QPDF *this_local;
  
  obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  getRoot((QPDF *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Extensions",&local_49);
  bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_90,"/Extensions",&local_91);
    QPDFObjectHandle::getKey(local_70,(string *)local_28);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,local_70);
    QPDFObjectHandle::~QPDFObjectHandle(local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    local_ba = 0;
    local_bb = 0;
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_28);
    local_189 = false;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_ba = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/ADBE",&local_b9);
      local_bb = 1;
      local_189 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_28,&local_b8);
    }
    if ((local_bb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((local_ba & 1) != 0) {
      std::allocator<char>::~allocator(&local_b9);
    }
    if (local_189 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f0,"/ADBE",&local_f1);
      QPDFObjectHandle::getKey(&local_d0,(string *)local_28);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,&local_d0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      local_11a = 0;
      local_11b = 0;
      bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_28);
      local_1c1 = false;
      if (bVar2) {
        std::allocator<char>::allocator();
        local_11a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"/ExtensionLevel",&local_119);
        local_11b = 1;
        local_1c1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_28,&local_118);
      }
      if ((local_11b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_118);
      }
      if ((local_11a & 1) != 0) {
        std::allocator<char>::~allocator(&local_119);
      }
      if (local_1c1 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_150,"/ExtensionLevel",&local_151);
        QPDFObjectHandle::getKey(&local_130,(string *)local_28);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,&local_130);
        QPDFObjectHandle::~QPDFObjectHandle(&local_130);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator(&local_151);
        bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_28);
        if (bVar2) {
          obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_28)
          ;
        }
      }
    }
  }
  iVar1 = obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return iVar1;
}

Assistant:

int
QPDF::getExtensionLevel()
{
    int result = 0;
    QPDFObjectHandle obj = getRoot();
    if (obj.hasKey("/Extensions")) {
        obj = obj.getKey("/Extensions");
        if (obj.isDictionary() && obj.hasKey("/ADBE")) {
            obj = obj.getKey("/ADBE");
            if (obj.isDictionary() && obj.hasKey("/ExtensionLevel")) {
                obj = obj.getKey("/ExtensionLevel");
                if (obj.isInteger()) {
                    result = obj.getIntValueAsInt();
                }
            }
        }
    }
    return result;
}